

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

LinTerms * mp::MergeSorted<mp::LinTerms>(LinTerms *__return_storage_ptr__,LinTerms *t1,LinTerms *t2)

{
  double c;
  int v;
  int v_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  LinTerms::reserve(__return_storage_ptr__,
                    (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_size +
                    (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_size);
  uVar3 = 0;
  uVar4 = 0;
  while( true ) {
    uVar1 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    uVar2 = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (uVar1 <= uVar4) {
      if (uVar3 < uVar2) {
        for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
          LinTerms::add_term(__return_storage_ptr__,
                             (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data
                             .super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr
                             [uVar3],(t2->vars_).super_small_vector_base<std::allocator<int>,_6U>.
                                     m_data.super_small_vector_data_base<int_*,_unsigned_long>.
                                     m_data_ptr[uVar3]);
          uVar2 = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                  super_small_vector_data_base<double_*,_unsigned_long>.m_size;
        }
      }
      return __return_storage_ptr__;
    }
    if (uVar2 <= uVar3) break;
    v = (t1->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar4];
    dVar5 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar4];
    v_00 = (t2->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
           super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar3];
    if (v < v_00) {
      LinTerms::add_term(__return_storage_ptr__,dVar5,v);
      uVar4 = uVar4 + 1;
    }
    else {
      c = (t2->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar3];
      if (v_00 < v) {
        LinTerms::add_term(__return_storage_ptr__,c,v_00);
      }
      else {
        dVar5 = dVar5 + c;
        if ((dVar5 != 0.0) || (NAN(dVar5))) {
          LinTerms::add_term(__return_storage_ptr__,dVar5,v);
        }
        uVar4 = uVar4 + 1;
      }
      uVar3 = uVar3 + 1;
    }
  }
  for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    LinTerms::add_term(__return_storage_ptr__,
                       (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr[uVar4],
                       (t1->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
                       super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr[uVar4]);
    uVar1 = (t1->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size;
  }
  return __return_storage_ptr__;
}

Assistant:

Terms MergeSorted(const Terms& t1, const Terms& t2) {
  assert(t1.is_sorted());
  assert(t2.is_sorted());
  Terms result;
  result.reserve(t1.size() + t2.size());

  size_t i1=0, i2=0;
  while (true) {
    if (i1<t1.size() && i2<t2.size()) {
      auto t1i = t1.IndexValue(i1);
      auto t2i = t2.IndexValue(i2);
      if (t1i.first < t2i.first) {
        result.add_index_value(t1i);
        ++i1;
      } else if (t1i.first > t2i.first) {
        result.add_index_value(t2i);
        ++i2;
      } else {
        t1i.second += t2i.second;
        if (t1i.second)
          result.add_index_value(t1i);
        ++i1;
        ++i2;
      }
    } else if (i1<t1.size()) {
      for ( ; i1<t1.size(); ++i1) {
        auto t1i = t1.IndexValue(i1);
        result.add_index_value(t1i);
      }
      break;
    } else if (i2<t2.size()) {
      for ( ; i2<t2.size(); ++i2) {
        auto t2i = t2.IndexValue(i2);
        result.add_index_value(t2i);
      }
      break;
    } else
      break;
  }

  return result;
}